

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseUser.cpp
# Opt level: O1

void __thiscall
BaseUser::BaseUser(BaseUser *this,char *passedFirstName,char *passedLastName,char *passedEmail,
                  char *passedPassword,bool passedAdmin)

{
  int iVar1;
  long lVar2;
  BaseUser *pBVar3;
  allocator local_61;
  char *local_60;
  char *local_58;
  string local_50;
  
  (this->super_Model<BaseUser>)._vptr_Model = (_func_int **)&PTR_save_0012dc38;
  local_60 = passedLastName;
  local_58 = passedPassword;
  if (Model<BaseUser>::objectList._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    iVar1 = 1;
  }
  else {
    lVar2 = std::_Rb_tree_decrement
                      (&Model<BaseUser>::objectList._M_t._M_impl.super__Rb_tree_header._M_header);
    iVar1 = *(int *)(lVar2 + 0x30) + 1;
  }
  (this->super_Model<BaseUser>).id = iVar1;
  (this->super_Model<BaseUser>)._vptr_Model = (_func_int **)&PTR_save_0012dc18;
  *(undefined8 *)&(this->super_Model<BaseUser>).field_0xc = 0;
  *(undefined8 *)&this->field_0x14 = 0;
  *(undefined8 *)&this->field_0x1c = 0;
  *(undefined8 *)&this->field_0x24 = 0;
  this->lastName[0] = '\0';
  this->lastName[1] = '\0';
  this->lastName[2] = '\0';
  this->lastName[3] = '\0';
  this->lastName[4] = '\0';
  this->lastName[5] = '\0';
  this->lastName[6] = '\0';
  this->lastName[7] = '\0';
  this->lastName[8] = '\0';
  this->lastName[9] = '\0';
  this->lastName[10] = '\0';
  this->lastName[0xb] = '\0';
  this->lastName[0xc] = '\0';
  this->lastName[0xd] = '\0';
  this->lastName[0xe] = '\0';
  this->lastName[0xf] = '\0';
  this->lastName[0x10] = '\0';
  this->lastName[0x11] = '\0';
  this->lastName[0x12] = '\0';
  this->lastName[0x13] = '\0';
  this->lastName[0x14] = '\0';
  this->lastName[0x15] = '\0';
  this->lastName[0x16] = '\0';
  this->lastName[0x17] = '\0';
  this->lastName[0x18] = '\0';
  this->lastName[0x19] = '\0';
  this->lastName[0x1a] = '\0';
  this->lastName[0x1b] = '\0';
  this->lastName[0x1c] = '\0';
  this->lastName[0x1d] = '\0';
  this->lastName[0x1e] = '\0';
  this->lastName[0x1f] = '\0';
  this->lastName[0x20] = '\0';
  this->lastName[0x21] = '\0';
  this->lastName[0x22] = '\0';
  this->lastName[0x23] = '\0';
  this->lastName[0x24] = '\0';
  this->lastName[0x25] = '\0';
  this->lastName[0x26] = '\0';
  this->lastName[0x27] = '\0';
  this->lastName[0x28] = '\0';
  this->lastName[0x29] = '\0';
  this->lastName[0x2a] = '\0';
  this->lastName[0x2b] = '\0';
  this->lastName[0x2c] = '\0';
  this->lastName[0x2d] = '\0';
  this->lastName[0x2e] = '\0';
  this->lastName[0x2f] = '\0';
  this->lastName[0x30] = '\0';
  this->lastName[0x31] = '\0';
  this->lastName[0x32] = '\0';
  this->lastName[0x33] = '\0';
  this->lastName[0x34] = '\0';
  this->lastName[0x35] = '\0';
  this->lastName[0x36] = '\0';
  this->lastName[0x37] = '\0';
  this->lastName[0x38] = '\0';
  this->lastName[0x39] = '\0';
  this->lastName[0x3a] = '\0';
  this->lastName[0x3b] = '\0';
  this->lastName[0x3c] = '\0';
  this->lastName[0x3d] = '\0';
  this->lastName[0x3e] = '\0';
  this->lastName[0x3f] = '\0';
  this->email[0] = '\0';
  this->email[1] = '\0';
  this->email[2] = '\0';
  this->email[3] = '\0';
  this->email[4] = '\0';
  this->email[5] = '\0';
  this->email[6] = '\0';
  this->email[7] = '\0';
  this->email[8] = '\0';
  this->email[9] = '\0';
  this->email[10] = '\0';
  this->email[0xb] = '\0';
  this->email[0xc] = '\0';
  this->email[0xd] = '\0';
  this->email[0xe] = '\0';
  this->email[0xf] = '\0';
  this->email[0x10] = '\0';
  this->email[0x11] = '\0';
  this->email[0x12] = '\0';
  this->email[0x13] = '\0';
  this->email[0x14] = '\0';
  this->email[0x15] = '\0';
  this->email[0x16] = '\0';
  this->email[0x17] = '\0';
  this->email[0x18] = '\0';
  this->email[0x19] = '\0';
  this->email[0x1a] = '\0';
  this->email[0x1b] = '\0';
  this->email[0x1c] = '\0';
  this->email[0x1d] = '\0';
  this->email[0x1e] = '\0';
  this->email[0x1f] = '\0';
  this->email[0x20] = '\0';
  this->email[0x21] = '\0';
  this->email[0x22] = '\0';
  this->email[0x23] = '\0';
  this->email[0x24] = '\0';
  this->email[0x25] = '\0';
  this->email[0x26] = '\0';
  this->email[0x27] = '\0';
  this->email[0x28] = '\0';
  this->email[0x29] = '\0';
  this->email[0x2a] = '\0';
  this->email[0x2b] = '\0';
  this->email[0x2c] = '\0';
  this->email[0x2d] = '\0';
  this->email[0x2e] = '\0';
  this->email[0x2f] = '\0';
  this->email[0x30] = '\0';
  this->email[0x31] = '\0';
  this->email[0x32] = '\0';
  this->email[0x33] = '\0';
  this->email[0x34] = '\0';
  this->email[0x35] = '\0';
  this->email[0x36] = '\0';
  this->email[0x37] = '\0';
  this->email[0x38] = '\0';
  this->email[0x39] = '\0';
  this->email[0x3a] = '\0';
  this->email[0x3b] = '\0';
  this->email[0x3c] = '\0';
  this->email[0x3d] = '\0';
  this->email[0x3e] = '\0';
  this->email[0x3f] = '\0';
  this->password[0] = '\0';
  this->password[1] = '\0';
  this->password[2] = '\0';
  this->password[3] = '\0';
  this->password[4] = '\0';
  this->password[5] = '\0';
  this->password[6] = '\0';
  this->password[7] = '\0';
  this->password[8] = '\0';
  this->password[9] = '\0';
  this->password[10] = '\0';
  this->password[0xb] = '\0';
  this->password[0xc] = '\0';
  this->password[0xd] = '\0';
  this->password[0xe] = '\0';
  this->password[0xf] = '\0';
  this->password[0x10] = '\0';
  this->password[0x11] = '\0';
  this->password[0x12] = '\0';
  this->password[0x13] = '\0';
  this->password[0x14] = '\0';
  this->password[0x15] = '\0';
  this->password[0x16] = '\0';
  this->password[0x17] = '\0';
  this->password[0x18] = '\0';
  this->password[0x19] = '\0';
  this->password[0x1a] = '\0';
  this->password[0x1b] = '\0';
  this->password[0x1c] = '\0';
  this->password[0x1d] = '\0';
  this->password[0x1e] = '\0';
  this->password[0x1f] = '\0';
  this->password[0x20] = '\0';
  this->password[0x21] = '\0';
  this->password[0x22] = '\0';
  this->password[0x23] = '\0';
  this->password[0x24] = '\0';
  this->password[0x25] = '\0';
  this->password[0x26] = '\0';
  this->password[0x27] = '\0';
  this->password[0x28] = '\0';
  this->password[0x29] = '\0';
  this->password[0x2a] = '\0';
  this->password[0x2b] = '\0';
  this->password[0x2c] = '\0';
  this->password[0x2d] = '\0';
  this->password[0x2e] = '\0';
  this->password[0x2f] = '\0';
  this->password[0x30] = '\0';
  this->password[0x31] = '\0';
  this->password[0x32] = '\0';
  this->password[0x33] = '\0';
  this->password[0x34] = '\0';
  this->password[0x35] = '\0';
  this->password[0x36] = '\0';
  this->password[0x37] = '\0';
  this->password[0x38] = '\0';
  this->password[0x39] = '\0';
  this->password[0x3a] = '\0';
  this->password[0x3b] = '\0';
  this->password[0x3c] = '\0';
  this->password[0x3d] = '\0';
  this->password[0x3e] = '\0';
  this->password[0x3f] = '\0';
  this->admin = passedAdmin;
  strcpy(&(this->super_Model<BaseUser>).field_0xc,passedFirstName);
  strcpy(this->lastName,local_60);
  strcpy(this->password,local_58);
  strcpy(this->email,passedEmail);
  std::__cxx11::string::string((string *)&local_50,passedEmail,&local_61);
  pBVar3 = findByEmail(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (pBVar3 != (BaseUser *)0x0) {
    (this->super_Model<BaseUser>).id = (pBVar3->super_Model<BaseUser>).id;
  }
  return;
}

Assistant:

BaseUser::BaseUser(const char *passedFirstName, const char *passedLastName, const char *passedEmail,
                   const char *passedPassword, bool passedAdmin) : admin(passedAdmin) {
    strcpy(firstName, passedFirstName);
    strcpy(lastName, passedLastName);
    strcpy(password, passedPassword);
    strcpy(email, passedEmail);
    BaseUser *user = BaseUser::findByEmail(passedEmail);
    if(user) id = user->getId();
}